

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
          (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this,PolyNf *t)

{
  PolyNf *in_RSI;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_RDI;
  PolyNf *in_stack_00000040;
  int in_stack_ffffffffffffffbc;
  IntegerConstantType *in_stack_ffffffffffffffc0;
  
  IntegerConstantType::IntegerConstantType(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  PolyNf::PolyNf(in_RSI,(PolyNf *)in_RDI);
  Polynom(this,(Numeral *)t,in_stack_00000040);
  IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x462b6b);
  integrity(in_RDI);
  return;
}

Assistant:

Polynom<Number>::Polynom(PolyNf t) 
  : Polynom(Numeral(1), t) 
{ integrity();  }